

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::handleRead(EventLoop *this)

{
  ssize_t v;
  LogStream *pLVar1;
  Logger local_ff8;
  undefined8 local_20;
  uint64_t one;
  
  local_20 = 1;
  v = read(this->wakeupFd_,&local_20,8);
  if (v != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x76);
    pLVar1 = LogStream::operator<<((LogStream *)&local_ff8,"Error: EventLoop::handleRead() reads");
    pLVar1 = LogStream::operator<<(pLVar1,v);
    LogStream::operator<<(pLVar1," bytes instead of 8");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void EventLoop::handleRead() {
    uint64_t one = 1;
    ssize_t n = read(wakeupFd_, &one, sizeof one);
    if (n != sizeof one) {
        LOG << "Error: EventLoop::handleRead() reads" << n << " bytes instead of 8";
    }
}